

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O2

Result __thiscall
wabt::interp::Memory::AtomicRmw<unsigned_char,unsigned_char(*&)(unsigned_char,unsigned_char)>
          (Memory *this,u64 offset,u64 addend,uchar rhs,
          BinopFunc<unsigned_char,_unsigned_char> **func,uchar *out)

{
  uchar val;
  Result RVar1;
  Enum EVar2;
  uchar lhs;
  uchar *local_38;
  
  local_38 = out;
  RVar1 = AtomicLoad<unsigned_char>(this,offset,addend,&lhs);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    val = (**func)(lhs,rhs);
    RVar1 = AtomicStore<unsigned_char>(this,offset,addend,val);
    if (RVar1.enum_ != Error) {
      *local_38 = lhs;
      EVar2 = Ok;
    }
  }
  return (Result)EVar2;
}

Assistant:

Result Memory::AtomicRmw(u64 offset, u64 addend, T rhs, F&& func, T* out) {
  T lhs;
  CHECK_RESULT(AtomicLoad(offset, addend, &lhs));
  CHECK_RESULT(AtomicStore(offset, addend, func(lhs, rhs)));
  *out = lhs;
  return Result::Ok;
}